

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

uint8_t * __thiscall
CoreML::Specification::ConstantPaddingLayerParams::_InternalSerialize
          (ConstantPaddingLayerParams *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  ulong *puVar1;
  float fVar2;
  bool bVar3;
  void *data;
  LogMessage *other;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  ulong *puVar9;
  undefined8 *puVar10;
  size_t __n;
  byte *pbVar11;
  LogFinisher local_69;
  LogMessage local_68;
  
  if (this->value_ != 0.0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    fVar2 = this->value_;
    *target = '\r';
    *(float *)(target + 1) = fVar2;
    target = target + 5;
  }
  uVar8 = (this->_padamounts_cached_byte_size_).super___atomic_base<int>._M_i;
  if (0 < (int)uVar8) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    if (stream->end_ <= target) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x36d);
      other = google::protobuf::internal::LogMessage::operator<<
                        (&local_68,"CHECK failed: ptr < end_: ");
      google::protobuf::internal::LogFinisher::operator=(&local_69,other);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
    }
    *target = 0x12;
    pbVar11 = target + 1;
    uVar7 = uVar8;
    if (0x7f < uVar8) {
      do {
        target = pbVar11;
        *target = (byte)uVar7 | 0x80;
        uVar8 = uVar7 >> 7;
        pbVar11 = target + 1;
        bVar3 = 0x3fff < uVar7;
        uVar7 = uVar8;
      } while (bVar3);
    }
    target = target + 2;
    *pbVar11 = (byte)uVar8;
    puVar9 = (ulong *)(this->padamounts_).arena_or_elements_;
    puVar1 = puVar9 + (this->padamounts_).current_size_;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar5 = *puVar9;
      *target = (byte)uVar5;
      if (uVar5 < 0x80) {
        pbVar11 = target + 1;
      }
      else {
        *target = (byte)uVar5 | 0x80;
        target[1] = (byte)(uVar5 >> 7);
        pbVar11 = target + 2;
        if (0x3fff < uVar5) {
          uVar6 = (ulong)target[1];
          uVar5 = uVar5 >> 7;
          do {
            pbVar11[-1] = (byte)uVar6 | 0x80;
            uVar4 = uVar5 >> 7;
            *pbVar11 = (byte)uVar4;
            pbVar11 = pbVar11 + 1;
            uVar6 = uVar4 & 0xffffffff;
            bVar3 = 0x3fff < uVar5;
            uVar5 = uVar4;
          } while (bVar3);
        }
      }
      target = pbVar11;
      puVar9 = puVar9 + 1;
    } while (puVar9 < puVar1);
  }
  if (this->padtogivenoutputsizemode_ == true) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    bVar3 = this->padtogivenoutputsizemode_;
    *target = 0x18;
    target[1] = bVar3;
    target = target + 2;
  }
  uVar5 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar5 & 1) != 0) {
    data = *(void **)((uVar5 & 0xfffffffffffffffc) + 8);
    uVar5 = (this->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar5 & 1) == 0) {
      puVar10 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
      if ((google::protobuf::internal::init_protobuf_defaults_state & 1) == 0) {
        google::protobuf::internal::InitProtobufDefaultsSlow();
      }
    }
    else {
      puVar10 = (undefined8 *)((uVar5 & 0xfffffffffffffffc) + 8);
    }
    __n = (size_t)(int)puVar10[1];
    if ((long)stream->end_ - (long)target < (long)__n) {
      target = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                         (stream,data,(int)puVar10[1],target);
    }
    else {
      memcpy(target,data,__n);
      target = target + __n;
    }
  }
  return target;
}

Assistant:

uint8_t* ConstantPaddingLayerParams::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.ConstantPaddingLayerParams)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // float value = 1;
  static_assert(sizeof(uint32_t) == sizeof(float), "Code assumes uint32_t and float are the same size.");
  float tmp_value = this->_internal_value();
  uint32_t raw_value;
  memcpy(&raw_value, &tmp_value, sizeof(tmp_value));
  if (raw_value != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteFloatToArray(1, this->_internal_value(), target);
  }

  // repeated uint64 padAmounts = 2;
  {
    int byte_size = _padamounts_cached_byte_size_.load(std::memory_order_relaxed);
    if (byte_size > 0) {
      target = stream->WriteUInt64Packed(
          2, _internal_padamounts(), byte_size, target);
    }
  }

  // bool padToGivenOutputSizeMode = 3;
  if (this->_internal_padtogivenoutputsizemode() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(3, this->_internal_padtogivenoutputsizemode(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.ConstantPaddingLayerParams)
  return target;
}